

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void google::protobuf::internal::MapFieldPrinterHelper::CopyKey
               (MapKey *key,Message *message,FieldDescriptor *field_desc)

{
  bool value;
  CppType CVar1;
  uint32 value_00;
  int32 value_01;
  LogMessage *other;
  uint64 value_02;
  string *psVar2;
  int64 value_03;
  Reflection *this;
  LogFinisher local_79;
  string local_78;
  LogMessage local_58;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  CVar1 = FieldDescriptor::cpp_type(field_desc);
  switch(CVar1) {
  case CPPTYPE_INT32:
    value_01 = MapKey::GetInt32Value(key);
    Reflection::SetInt32(this,message,field_desc,value_01);
    return;
  case CPPTYPE_INT64:
    value_03 = MapKey::GetInt64Value(key);
    Reflection::SetInt64(this,message,field_desc,value_03);
    return;
  case CPPTYPE_UINT32:
    value_00 = MapKey::GetUInt32Value(key);
    Reflection::SetUInt32(this,message,field_desc,value_00);
    return;
  case CPPTYPE_UINT64:
    value_02 = MapKey::GetUInt64Value(key);
    Reflection::SetUInt64(this,message,field_desc,value_02);
    return;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x855);
    other = LogMessage::operator<<(&local_58,"Not supported.");
    LogFinisher::operator=(&local_79,other);
    LogMessage::~LogMessage(&local_58);
    break;
  case CPPTYPE_BOOL:
    value = MapKey::GetBoolValue(key);
    Reflection::SetBool(this,message,field_desc,value);
    return;
  case CPPTYPE_STRING:
    psVar2 = MapKey::GetStringValue_abi_cxx11_(key);
    std::__cxx11::string::string((string *)&local_78,(string *)psVar2);
    Reflection::SetString(this,message,field_desc,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void MapFieldPrinterHelper::CopyKey(const MapKey& key, Message* message,
                                    const FieldDescriptor* field_desc) {
  const Reflection* reflection = message->GetReflection();
  switch (field_desc->cpp_type()) {
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      GOOGLE_LOG(ERROR) << "Not supported.";
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      reflection->SetString(message, field_desc, key.GetStringValue());
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      reflection->SetInt64(message, field_desc, key.GetInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      reflection->SetInt32(message, field_desc, key.GetInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      reflection->SetUInt64(message, field_desc, key.GetUInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      reflection->SetUInt32(message, field_desc, key.GetUInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      reflection->SetBool(message, field_desc, key.GetBoolValue());
      return;
  }
}